

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_MeshComponentRef::IsValid(ON_MeshComponentRef *this,ON_TextLog *text_log)

{
  bool bVar1;
  char *format;
  
  if (this->m_mesh == (ON_Mesh *)0x0) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    format = "m_mesh = nullptr.\n";
  }
  else {
    bVar1 = ON_COMPONENT_INDEX::IsMeshComponentIndex(&this->m_mesh_ci);
    if (bVar1) {
      bVar1 = ON_Mesh::IsValidMeshComponentIndex(this->m_mesh,this->m_mesh_ci);
      if (bVar1) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = " has an invalid m_index.\n";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = " has an invalid m_type.\n";
    }
    ON_TextLog::Print(text_log,"m_mesh_ci = ");
    ON_COMPONENT_INDEX::Dump(&this->m_mesh_ci,text_log);
  }
  ON_TextLog::Print(text_log,format);
  return false;
}

Assistant:

bool ON_MeshComponentRef::IsValid( ON_TextLog* text_log ) const
{
  if ( 0 == m_mesh)
  {
    if ( 0 != text_log )
    {
      text_log->Print("m_mesh = nullptr.\n");
    }
    return false;
  }

  if ( false == m_mesh_ci.IsMeshComponentIndex() )
  {
    if ( 0 != text_log )
    {
      text_log->Print("m_mesh_ci = ");
      m_mesh_ci.Dump(*text_log);
      text_log->Print(" has an invalid m_type.\n");
    }
    return false;
  }

  if ( false == m_mesh->IsValidMeshComponentIndex(m_mesh_ci) )
  {
    if ( 0 != text_log )
    {
      text_log->Print("m_mesh_ci = ");
      m_mesh_ci.Dump(*text_log);
      text_log->Print(" has an invalid m_index.\n");
    }
    return false;
  }

  return true;
}